

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O2

void * __thiscall google::protobuf::internal::ExtensionSet::Extension::PrefetchPtr(Extension *this)

{
  string *psVar1;
  bool local_19;
  LogMessageFatal local_18 [16];
  
  local_18[0] = (LogMessageFatal)(this->field_0xa & 1);
  local_19 = (bool)((byte)(this->type - 9) < 4 | this->is_repeated);
  psVar1 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                     ((bool *)local_18,&local_19,
                      "is_pointer == is_repeated || FieldTypeIsPointer(type)");
  if (psVar1 == (string *)0x0) {
    if ((this->field_0xa & 1) != 0) {
      this = (Extension *)(this->field_0).int64_t_value;
    }
    return this;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.h"
             ,0x2ab,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_18);
}

Assistant:

const void* PrefetchPtr() const {
      ABSL_DCHECK_EQ(is_pointer, is_repeated || FieldTypeIsPointer(type));
      // We don't want to prefetch invalid/null pointers so if there isn't a
      // pointer to prefetch, then return `this`.
      return is_pointer ? absl::bit_cast<const void*>(ptr) : this;
    }